

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall
google::anon_unknown_10::LogFileObject::Write
          (LogFileObject *this,bool force_flush,time_t timestamp,char *message,size_t message_len)

{
  _Safe_iterator_base *p_Var1;
  long lVar2;
  pointer pcVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int32 iVar8;
  long *plVar9;
  ostream *poVar10;
  int64 iVar11;
  int *piVar12;
  size_type sVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  string *psVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  reference pbVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined7 in_register_00000031;
  char *pcVar19;
  uint32 uVar20;
  WallTime WVar21;
  undefined1 auStack_648 [8];
  ostringstream time_pid_stream;
  ios_base local_5d8 [112];
  char acStack_568 [160];
  undefined1 auStack_4c8 [8];
  ostringstream file_header_stream;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [6];
  ios_base local_458 [112];
  char acStack_3e8 [152];
  undefined1 local_350 [8];
  const_iterator dir;
  ios_base local_2d0 [96];
  char acStack_270 [168];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  __string_type __str;
  time_t timestamp_local;
  MutexLock l;
  tm tm_time;
  string uidname;
  string local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  FILE **local_80;
  undefined1 local_78 [8];
  string hostname;
  undefined1 local_50 [8];
  string stripped_filename;
  
  timestamp_local = (time_t)&this->lock_;
  __str.field_2._8_8_ = timestamp;
  __str_1.field_2._8_8_ = message;
  if (((this->lock_).is_safe_ == true) &&
     (iVar6 = pthread_rwlock_wrlock((pthread_rwlock_t *)timestamp_local), iVar6 != 0)) {
    abort();
  }
  if ((this->base_filename_selected_ == true) && ((this->base_filename_)._M_string_length == 0))
  goto LAB_001227c5;
  iVar6 = 1;
  if (fLI::FLAGS_max_log_size - 1U < 0xfff) {
    iVar6 = fLI::FLAGS_max_log_size;
  }
  if ((iVar6 <= (int)(this->file_length_ >> 0x14)) ||
     (bVar5 = glog_internal_namespace_::PidHasChanged(), bVar5)) {
    if ((FILE *)this->file_ != (FILE *)0x0) {
      fclose((FILE *)this->file_);
    }
    this->file_ = (FILE *)0x0;
    this->bytes_since_flush_ = 0;
    this->dropped_mem_length_ = 0;
    this->file_length_ = 0;
    this->rollover_attempt_ = 0x1f;
LAB_00121321:
    uVar7 = this->rollover_attempt_ + 1;
    this->rollover_attempt_ = uVar7;
    if (uVar7 != 0x20) goto LAB_001227c5;
    this->rollover_attempt_ = 0;
    if (fLB::FLAGS_log_utc_time == 1) {
      gmtime_r((time_t *)(__str.field_2._M_local_buf + 8),(tm *)&l);
    }
    else {
      localtime_r((time_t *)(__str.field_2._M_local_buf + 8),(tm *)&l);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_648);
    lVar2 = *(long *)&((_Safe_iterator_base *)((long)auStack_648 + -0x20))->_M_version;
    if (acStack_568[lVar2 + 1] == '\0') {
      std::ios::widen((char)auStack_648 + (char)lVar2);
      acStack_568[lVar2 + 1] = '\x01';
    }
    iVar6 = tm_time.tm_mday + 0x76c;
    acStack_568[lVar2] = '0';
    plVar9 = (long *)std::ostream::operator<<(auStack_648,iVar6);
    *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 2;
    plVar9 = (long *)std::ostream::operator<<(plVar9,tm_time.tm_hour + 1);
    *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(plVar9,tm_time.tm_min);
    local_350[0] = (stringstream)0x2d;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
    *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
    plVar9 = (long *)std::ostream::operator<<(poVar10,tm_time.tm_sec);
    *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 2;
    plVar9 = (long *)std::ostream::operator<<(plVar9,l.mu_._4_4_);
    *(undefined8 *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x10) = 2;
    poVar10 = (ostream *)std::ostream::operator<<(plVar9,(int)l.mu_);
    local_350[0] = (stringstream)0x2e;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
    iVar8 = glog_internal_namespace_::GetMainThreadPid();
    std::ostream::operator<<(poVar10,iVar8);
    std::__cxx11::stringbuf::str();
    if (this->base_filename_selected_ == true) {
      bVar5 = CreateLogfile(this,&local_c8);
      if (bVar5) {
LAB_00121502:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_4c8);
        lVar2 = *(long *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((long)auStack_4c8 + -0x20))->_M_local_buf + 8);
        if ((acStack_3e8 + 1)[lVar2] == '\0') {
          std::ios::widen((char)auStack_4c8 + (char)lVar2);
          (acStack_3e8 + 1)[lVar2] = '\x01';
        }
        acStack_3e8[lVar2] = '0';
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_4c8,"Log file created at: ",0x15);
        poVar10 = (ostream *)std::ostream::operator<<(auStack_4c8,tm_time.tm_mday + 0x76c);
        local_350[0] = (stringstream)0x2f;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,tm_time.tm_hour + 1);
        local_350[0] = (stringstream)0x2f;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,tm_time.tm_min);
        local_350[0] = (stringstream)0x20;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,tm_time.tm_sec);
        local_350[0] = (stringstream)0x3a;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,l.mu_._4_4_);
        local_350[0] = (stringstream)0x3a;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)l.mu_);
        pcVar19 = "\n";
        if (fLB::FLAGS_log_utc_time != 0) {
          pcVar19 = " UTC\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,pcVar19,(ulong)fLB::FLAGS_log_utc_time * 4 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Running on machine: ",0x14);
        LogDestination::hostname_abi_cxx11_();
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,LogDestination::hostname__abi_cxx11_,DAT_0014fc20);
        local_350[0] = (stringstream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        if (_DAT_0014fcb8 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_4c8,"Application fingerprint: ",0x19);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)auStack_4c8,
                               (anonymous_namespace)::g_application_fingerprint_abi_cxx11_,
                               _DAT_0014fcb8);
          local_350[0] = (stringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_4c8,"Running duration (h:mm:ss): ",0x1c);
        WVar21 = glog_internal_namespace_::WallTime_Now();
        hostname.field_2._8_8_ = WVar21 - this->start_time_;
        std::__cxx11::stringstream::stringstream((stringstream *)local_350);
        sVar13 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_350 + -0x20))->_M_string_length;
        if (acStack_270[sVar13 + 1] == '\0') {
          std::ios::widen((char)local_350 + (char)sVar13);
          acStack_270[sVar13 + 1] = '\x01';
        }
        iVar6 = (int)(double)hostname.field_2._8_8_;
        acStack_270[sVar13] = '0';
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            (&dir.
                              super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                              .
                              super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                              .super__Safe_iterator_base,iVar6 / 0xe10);
        local_78[0] = ':';
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_78,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(iVar6 / 0x3c) % 0x3c);
        local_78[0] = 0x3a;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_78,1);
        *(undefined8 *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = 2;
        std::ostream::operator<<(poVar10,iVar6 % 0x3c);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_350);
        std::ios_base::~ios_base(local_2d0);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)auStack_4c8,(char *)local_50,
                             (long)stripped_filename._M_dataplus._M_p);
        local_350[0] = (stringstream)0xa;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Log line format: [IWEF]yyyymmdd hh:mm:ss.uuuuuu ",0x30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"threadid file:line] msg",0x17);
        local_350[0] = (stringstream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_350,1);
        if (local_50 != (undefined1  [8])&stripped_filename._M_string_length) {
          operator_delete((void *)local_50,stripped_filename._M_string_length + 1);
        }
        std::__cxx11::stringbuf::str();
        _Var4 = dir.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                .
                super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ;
        fwrite((void *)local_350,1,
               (size_t)dir.
                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                       .
                       super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                       .
                       super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_current,(FILE *)this->file_);
        this->file_length_ = this->file_length_ + (int)_Var4._M_current;
        this->bytes_since_flush_ = this->bytes_since_flush_ + (int)_Var4._M_current;
        if (local_350 !=
            (undefined1  [8])
            &dir.
             super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
             .
             super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
             .super__Safe_iterator_base) {
          operator_delete((void *)local_350,
                          (size_t)((long)&(dir.
                                           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                           .
                                           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                           .super__Safe_iterator_base._M_sequence)->_M_iterators + 1
                                  ));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_4c8);
        std::ios_base::~ios_base(local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_648);
        std::ios_base::~ios_base(local_5d8);
        goto LAB_00121a03;
      }
      _GLOBAL__N_1::LogFileObject::Write((LogFileObject *)&local_c8);
    }
    else {
      pcVar19 = glog_internal_namespace_::ProgramInvocationShortName();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,pcVar19,(allocator<char> *)local_350);
      local_78 = (undefined1  [8])&hostname._M_string_length;
      hostname._M_dataplus._M_p = (pointer)0x0;
      hostname._M_string_length._0_1_ = 0;
      GetHostName((string *)local_78);
      psVar15 = glog_internal_namespace_::MyUserName_abi_cxx11_();
      tm_time.tm_zone = (char *)&uidname._M_string_length;
      pcVar3 = (psVar15->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&tm_time.tm_zone,pcVar3,pcVar3 + psVar15->_M_string_length);
      if (uidname._M_dataplus._M_p == (pointer)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &tm_time.tm_zone,0,0,"invalid-user",0xc);
      }
      local_168 = (undefined1  [8])&__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_168,local_50,stripped_filename._M_dataplus._M_p + (long)local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                     (size_type)__str._M_dataplus._M_p,0,1,'.');
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_168,(char *)local_78,(size_type)hostname._M_dataplus._M_p);
      paVar18 = &pbVar16->field_2;
      local_1c8._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p == paVar18) {
        local_1c8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_1c8._M_string_length = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(&local_1c8,local_1c8._M_string_length,0,1,'.');
      paVar18 = &pbVar16->field_2;
      local_188._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == paVar18) {
        local_188.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_188.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_188._M_string_length = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_188,tm_time.tm_zone,(size_type)uidname._M_dataplus._M_p);
      paVar18 = &pbVar16->field_2;
      local_1a8._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p == paVar18) {
        local_1a8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_1a8._M_string_length = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_1a8,".log.");
      paVar18 = &pbVar16->field_2;
      local_a8 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
      if (local_a8 == (undefined1  [8])paVar18) {
        __str_1._M_string_length = paVar18->_M_allocated_capacity;
        __str_1.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar16->field_2 + 8);
        local_a8 = (undefined1  [8])&__str_1._M_string_length;
      }
      else {
        __str_1._M_string_length = paVar18->_M_allocated_capacity;
      }
      __str_1._M_dataplus._M_p = (pointer)pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                       ,*(char **)(LogSeverityNames + (long)this->severity_ * 8));
      paVar18 = &pbVar16->field_2;
      auStack_4c8 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
      if (auStack_4c8 == (undefined1  [8])paVar18) {
        local_4b8[0]._0_8_ = paVar18->_M_allocated_capacity;
        local_4b8[0]._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        auStack_4c8 = (undefined1  [8])local_4b8;
      }
      else {
        local_4b8[0]._0_8_ = paVar18->_M_allocated_capacity;
      }
      _file_header_stream = (_Safe_sequence_base *)pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      uidname.field_2._12_4_ = (int)CONCAT71(in_register_00000031,force_flush);
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               auStack_4c8,(size_type)_file_header_stream,0,1,'.');
      p_Var1 = &dir.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                .super__Safe_iterator_base;
      paVar18 = &pbVar16->field_2;
      local_350 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
      if (local_350 == (undefined1  [8])paVar18) {
        dir.
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
        .
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        .super__Safe_iterator_base._M_sequence =
             (_Safe_sequence_base *)paVar18->_M_allocated_capacity;
        dir.
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
        .
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        .super__Safe_iterator_base._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        local_350 = (undefined1  [8])p_Var1;
      }
      else {
        dir.
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
        .
        super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        .super__Safe_iterator_base._M_sequence =
             (_Safe_sequence_base *)paVar18->_M_allocated_capacity;
      }
      dir.
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
      .
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
      .
      super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
      if (local_350 != (undefined1  [8])p_Var1) {
        operator_delete((void *)local_350,
                        (size_t)((long)&(dir.
                                         super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                         .
                                         super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                         .super__Safe_iterator_base._M_sequence)->_M_iterators + 1))
        ;
      }
      if (auStack_4c8 != (undefined1  [8])local_4b8) {
        operator_delete((void *)auStack_4c8,local_4b8[0]._M_allocated_capacity + 1);
      }
      if (local_a8 != (undefined1  [8])&__str_1._M_string_length) {
        operator_delete((void *)local_a8,__str_1._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_168 != (undefined1  [8])&__str._M_string_length) {
        operator_delete((void *)local_168,__str._M_string_length + 1);
      }
      hostname.field_2._8_8_ = GetLoggingDirectories_abi_cxx11_();
      __gnu_debug::
      _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
      ::_Safe_iterator((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                        *)local_350,
                       (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)hostname.field_2._8_8_)->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (_Safe_sequence_base *)hostname.field_2._8_8_);
      while( true ) {
        __gnu_debug::
        _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        ::_Safe_iterator((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                          *)auStack_4c8,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (hostname.field_2._8_8_ + 0x20),
                         (_Safe_sequence_base *)hostname.field_2._8_8_);
        bVar5 = __gnu_debug::operator!=((_Self *)local_350,(_Self *)auStack_4c8);
        __gnu_debug::_Safe_iterator_base::_M_detach();
        if (!bVar5) break;
        pbVar17 = __gnu_debug::
                  _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                  ::operator*((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                               *)local_350);
        pcVar3 = (pbVar17->_M_dataplus)._M_p;
        local_a8 = (undefined1  [8])&__str_1._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,pcVar3,pcVar3 + pbVar17->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,"/"
                  );
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,(char *)local_50,(size_type)stripped_filename._M_dataplus._M_p)
        ;
        paVar18 = &pbVar16->field_2;
        auStack_4c8 = (undefined1  [8])(pbVar16->_M_dataplus)._M_p;
        if (auStack_4c8 == (undefined1  [8])paVar18) {
          local_4b8[0]._0_8_ = paVar18->_M_allocated_capacity;
          local_4b8[0]._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
          auStack_4c8 = (undefined1  [8])local_4b8;
        }
        else {
          local_4b8[0]._0_8_ = paVar18->_M_allocated_capacity;
        }
        _file_header_stream = (_Safe_sequence_base *)pbVar16->_M_string_length;
        (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar16->_M_string_length = 0;
        (pbVar16->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&this->base_filename_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_4c8)
        ;
        if (auStack_4c8 != (undefined1  [8])local_4b8) {
          operator_delete((void *)auStack_4c8,local_4b8[0]._M_allocated_capacity + 1);
        }
        if (local_a8 != (undefined1  [8])&__str_1._M_string_length) {
          operator_delete((void *)local_a8,__str_1._M_string_length + 1);
        }
        bVar5 = CreateLogfile(this,&local_c8);
        if (bVar5) {
          __gnu_debug::_Safe_iterator_base::_M_detach();
          force_flush = SUB41(uidname.field_2._12_4_,0);
          if ((size_type *)tm_time.tm_zone != &uidname._M_string_length) {
            operator_delete(tm_time.tm_zone,uidname._M_string_length + 1);
          }
          if (local_78 != (undefined1  [8])&hostname._M_string_length) {
            operator_delete((void *)local_78,
                            CONCAT71(hostname._M_string_length._1_7_,
                                     (undefined1)hostname._M_string_length) + 1);
          }
          if (local_50 != (undefined1  [8])&stripped_filename._M_string_length) {
            operator_delete((void *)local_50,stripped_filename._M_string_length + 1);
          }
          goto LAB_00121502;
        }
        __gnu_debug::
        _Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
        ::operator++((_Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                      *)local_350);
      }
      __gnu_debug::_Safe_iterator_base::_M_detach();
      perror("Could not create logging file");
      fprintf(_stderr,"COULD NOT CREATE A LOGGINGFILE %s!",local_c8._M_dataplus._M_p);
      if ((size_type *)tm_time.tm_zone != &uidname._M_string_length) {
        operator_delete(tm_time.tm_zone,uidname._M_string_length + 1);
      }
      if (local_78 != (undefined1  [8])&hostname._M_string_length) {
        operator_delete((void *)local_78,
                        CONCAT71(hostname._M_string_length._1_7_,
                                 (undefined1)hostname._M_string_length) + 1);
      }
      if (local_50 != (undefined1  [8])&stripped_filename._M_string_length) {
        operator_delete((void *)local_50,stripped_filename._M_string_length + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_648);
    std::ios_base::~ios_base(local_5d8);
    goto LAB_001227c5;
  }
  if (this->file_ == (FILE *)0x0) goto LAB_00121321;
LAB_00121a03:
  local_80 = &this->file_;
  if (stop_writing != '\0') {
    iVar11 = glog_internal_namespace_::CycleClock_Now();
    if (this->next_flush_time_ <= iVar11) {
      stop_writing = '\0';
    }
    goto LAB_001227c5;
  }
  piVar12 = __errno_location();
  *piVar12 = 0;
  fwrite((void *)__str_1.field_2._8_8_,1,message_len,(FILE *)*local_80);
  if ((fLB::FLAGS_stop_logging_if_full_disk == '\x01') && (*piVar12 == 0x1c)) {
    stop_writing = '\x01';
    goto LAB_001227c5;
  }
  this->file_length_ = this->file_length_ + (int)message_len;
  uVar7 = (int)message_len + this->bytes_since_flush_;
  this->bytes_since_flush_ = uVar7;
  if ((uVar7 < 1000000 && force_flush == false) &&
     (iVar11 = glog_internal_namespace_::CycleClock_Now(), iVar11 < this->next_flush_time_))
  goto LAB_001227c5;
  FlushUnlocked(this);
  if ((fLB::FLAGS_drop_log_memory == '\x01') && (0x2fffff < this->file_length_)) {
    uVar20 = (this->file_length_ & 0xfff00000) - 0x100000;
    uVar7 = uVar20 - this->dropped_mem_length_;
    if (0x1fffff < uVar7) {
      iVar6 = fileno((FILE *)this->file_);
      posix_fadvise(iVar6,(ulong)this->dropped_mem_length_,(ulong)uVar7,4);
      this->dropped_mem_length_ = uVar20;
    }
  }
  if (_ZN6google12_GLOBAL__N_111log_cleanerE_0 != '\x01') goto LAB_001227c5;
  if (_ZN6google12_GLOBAL__N_111log_cleanerE_1 < 0) {
    __assert_fail("enabled_ && overdue_days_ >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                  ,0x52a,
                  "void google::(anonymous namespace)::LogCleaner::Run(bool, const string &, const string &) const"
                 );
  }
  if (this->base_filename_selected_ == false) {
    auStack_648 = (undefined1  [8])0x0;
    _time_pid_stream = (_Safe_iterator_base *)0x0;
    pvVar14 = GetLoggingDirectories_abi_cxx11_();
    std::__debug::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_648,pvVar14);
  }
  else {
    if ((this->base_filename_)._M_string_length == 0) {
      __assert_fail("!base_filename_selected || !base_filename.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                    ,0x52b,
                    "void google::(anonymous namespace)::LogCleaner::Run(bool, const string &, const string &) const"
                   );
    }
    auStack_648 = (undefined1  [8])0x0;
    _time_pid_stream = (_Safe_iterator_base *)0x0;
    sVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of(&this->base_filename_,
                          "/ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+-_.=/:,@"
                          ,0,1);
    if (sVar13 == 0xffffffffffffffff) {
      p_Var1 = &dir.
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                .
                super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                .super__Safe_iterator_base;
      dir.
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
      .
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
      .super__Safe_iterator_base._M_sequence =
           (_Safe_sequence_base *)
           CONCAT62(dir.
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                    .
                    super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                    .super__Safe_iterator_base._M_sequence._2_6_,0x2e);
      dir.
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
      .
      super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
      .
      super___normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      local_350 = (undefined1  [8])p_Var1;
      std::__debug::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_648,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
      if (local_350 != (undefined1  [8])p_Var1) goto LAB_00121d53;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                 &this->base_filename_,0,sVar13 + 1);
      std::__debug::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_648,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350);
      if (local_350 !=
          (undefined1  [8])
          &dir.
           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
           .
           super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
           .super__Safe_iterator_base) {
LAB_00121d53:
        operator_delete((void *)local_350,
                        (size_t)((long)&(dir.
                                         super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::bidirectional_iterator_tag>
                                         .
                                         super__Safe_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx1998::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::forward_iterator_tag>
                                         .super__Safe_iterator_base._M_sequence)->_M_iterators + 1))
        ;
      }
    }
  }
  std::__debug::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_648);
LAB_001227c5:
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&timestamp_local);
  return;
}

Assistant:

void LogFileObject::Write(bool force_flush,
                          time_t timestamp,
                          const char* message,
                          size_t message_len) {
  MutexLock l(&lock_);

  // We don't log if the base_name_ is "" (which means "don't write")
  if (base_filename_selected_ && base_filename_.empty()) {
    return;
  }

  if (static_cast<int>(file_length_ >> 20) >= MaxLogSize() ||
      PidHasChanged()) {
    if (file_ != NULL) fclose(file_);
    file_ = NULL;
    file_length_ = bytes_since_flush_ = dropped_mem_length_ = 0;
    rollover_attempt_ = kRolloverAttemptFrequency-1;
  }

  // If there's no destination file, make one before outputting
  if (file_ == NULL) {
    // Try to rollover the log file every 32 log messages.  The only time
    // this could matter would be when we have trouble creating the log
    // file.  If that happens, we'll lose lots of log messages, of course!
    if (++rollover_attempt_ != kRolloverAttemptFrequency) return;
    rollover_attempt_ = 0;

    struct ::tm tm_time;
    if (FLAGS_log_utc_time)
        gmtime_r(&timestamp, &tm_time);
    else
        localtime_r(&timestamp, &tm_time);

    // The logfile's filename will have the date/time & pid in it
    ostringstream time_pid_stream;
    time_pid_stream.fill('0');
    time_pid_stream << 1900+tm_time.tm_year
                    << setw(2) << 1+tm_time.tm_mon
                    << setw(2) << tm_time.tm_mday
                    << '-'
                    << setw(2) << tm_time.tm_hour
                    << setw(2) << tm_time.tm_min
                    << setw(2) << tm_time.tm_sec
                    << '.'
                    << GetMainThreadPid();
    const string& time_pid_string = time_pid_stream.str();

    if (base_filename_selected_) {
      if (!CreateLogfile(time_pid_string)) {
        perror("Could not create log file");
        fprintf(stderr, "COULD NOT CREATE LOGFILE '%s'!\n",
                time_pid_string.c_str());
        return;
      }
    } else {
      // If no base filename for logs of this severity has been set, use a
      // default base filename of
      // "<program name>.<hostname>.<user name>.log.<severity level>.".  So
      // logfiles will have names like
      // webserver.examplehost.root.log.INFO.19990817-150000.4354, where
      // 19990817 is a date (1999 August 17), 150000 is a time (15:00:00),
      // and 4354 is the pid of the logging process.  The date & time reflect
      // when the file was created for output.
      //
      // Where does the file get put?  Successively try the directories
      // "/tmp", and "."
      string stripped_filename(
          glog_internal_namespace_::ProgramInvocationShortName());
      string hostname;
      GetHostName(&hostname);

      string uidname = MyUserName();
      // We should not call CHECK() here because this function can be
      // called after holding on to log_mutex. We don't want to
      // attempt to hold on to the same mutex, and get into a
      // deadlock. Simply use a name like invalid-user.
      if (uidname.empty()) uidname = "invalid-user";

      stripped_filename = stripped_filename+'.'+hostname+'.'
                          +uidname+".log."
                          +LogSeverityNames[severity_]+'.';
      // We're going to (potentially) try to put logs in several different dirs
      const vector<string> & log_dirs = GetLoggingDirectories();

      // Go through the list of dirs, and try to create the log file in each
      // until we succeed or run out of options
      bool success = false;
      for (vector<string>::const_iterator dir = log_dirs.begin();
           dir != log_dirs.end();
           ++dir) {
        base_filename_ = *dir + "/" + stripped_filename;
        if ( CreateLogfile(time_pid_string) ) {
          success = true;
          break;
        }
      }
      // If we never succeeded, we have to give up
      if ( success == false ) {
        perror("Could not create logging file");
        fprintf(stderr, "COULD NOT CREATE A LOGGINGFILE %s!",
                time_pid_string.c_str());
        return;
      }
    }

    // Write a header message into the log file
    ostringstream file_header_stream;
    file_header_stream.fill('0');
    file_header_stream << "Log file created at: "
                       << 1900+tm_time.tm_year << '/'
                       << setw(2) << 1+tm_time.tm_mon << '/'
                       << setw(2) << tm_time.tm_mday
                       << ' '
                       << setw(2) << tm_time.tm_hour << ':'
                       << setw(2) << tm_time.tm_min << ':'
                       << setw(2) << tm_time.tm_sec << (FLAGS_log_utc_time ? " UTC\n" : "\n")
                       << "Running on machine: "
                       << LogDestination::hostname() << '\n';

    if(!g_application_fingerprint.empty()) {
      file_header_stream << "Application fingerprint: " << g_application_fingerprint << '\n';
    }

    file_header_stream << "Running duration (h:mm:ss): "
                       << PrettyDuration(static_cast<int>(WallTime_Now() - start_time_)) << '\n'
                       << "Log line format: [IWEF]yyyymmdd hh:mm:ss.uuuuuu "
                       << "threadid file:line] msg" << '\n';
    const string& file_header_string = file_header_stream.str();

    const size_t header_len = file_header_string.size();
    fwrite(file_header_string.data(), 1, header_len, file_);
    file_length_ += header_len;
    bytes_since_flush_ += header_len;
  }

  // Write to LOG file
  if ( !stop_writing ) {
    // fwrite() doesn't return an error when the disk is full, for
    // messages that are less than 4096 bytes. When the disk is full,
    // it returns the message length for messages that are less than
    // 4096 bytes. fwrite() returns 4096 for message lengths that are
    // greater than 4096, thereby indicating an error.
    errno = 0;
    fwrite(message, 1, message_len, file_);
    if ( FLAGS_stop_logging_if_full_disk &&
         errno == ENOSPC ) {  // disk full, stop writing to disk
      stop_writing = true;  // until the disk is
      return;
    } else {
      file_length_ += message_len;
      bytes_since_flush_ += message_len;
    }
  } else {
    if ( CycleClock_Now() >= next_flush_time_ )
      stop_writing = false;  // check to see if disk has free space.
    return;  // no need to flush
  }

  // See important msgs *now*.  Also, flush logs at least every 10^6 chars,
  // or every "FLAGS_logbufsecs" seconds.
  if ( force_flush ||
       (bytes_since_flush_ >= 1000000) ||
       (CycleClock_Now() >= next_flush_time_) ) {
    FlushUnlocked();
#ifdef GLOG_OS_LINUX
    // Only consider files >= 3MiB
    if (FLAGS_drop_log_memory && file_length_ >= (3 << 20)) {
      // Don't evict the most recent 1-2MiB so as not to impact a tailer
      // of the log file and to avoid page rounding issue on linux < 4.7
      uint32 total_drop_length = (file_length_ & ~((1 << 20U) - 1U)) - (1U << 20U);
      uint32 this_drop_length = total_drop_length - dropped_mem_length_;
      if (this_drop_length >= (2 << 20)) {
        // Only advise when >= 2MiB to drop
# if defined(__ANDROID__) && defined(__ANDROID_API__) && (__ANDROID_API__ < 21)
        // 'posix_fadvise' introduced in API 21:
        // * https://android.googlesource.com/platform/bionic/+/6880f936173081297be0dc12f687d341b86a4cfa/libc/libc.map.txt#732
# else
        posix_fadvise(fileno(file_), dropped_mem_length_, this_drop_length,
                      POSIX_FADV_DONTNEED);
# endif
        dropped_mem_length_ = total_drop_length;
      }
    }
#endif

    // Remove old logs
    if (log_cleaner.enabled()) {
      log_cleaner.Run(base_filename_selected_,
                      base_filename_,
                      filename_extension_);
    }
  }
}